

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

void SUNSparseMatrix_Print(SUNMatrix A,FILE *outfile)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  
  bVar8 = *(int *)((long)A->content + 0x28) == 0;
  pcVar4 = "CSR";
  if (bVar8) {
    pcVar4 = "CSC";
  }
  pcVar7 = "row";
  if (bVar8) {
    pcVar7 = "col";
  }
  fputc(10,(FILE *)outfile);
  puVar1 = (undefined8 *)A->content;
  fprintf((FILE *)outfile,"%ld by %ld %s matrix, NNZ: %ld \n",*puVar1,puVar1[1],pcVar4,puVar1[2]);
  lVar5 = 0;
  while (lVar5 < *(long *)((long)A->content + 0x18)) {
    lVar3 = *(long *)((long)A->content + 0x38);
    fprintf((FILE *)outfile,"%s %ld : locations %ld to %ld\n",pcVar7,lVar5,
            *(undefined8 *)(lVar3 + lVar5 * 8),*(long *)(lVar3 + 8 + lVar5 * 8) + -1);
    fwrite("  ",2,1,(FILE *)outfile);
    pvVar2 = A->content;
    lVar3 = *(long *)((long)pvVar2 + 0x38);
    for (lVar6 = *(long *)(lVar3 + lVar5 * 8); lVar6 < *(long *)(lVar3 + (lVar5 + 1) * 8);
        lVar6 = lVar6 + 1) {
      fprintf((FILE *)outfile,"%ld: % .15e  ",
              *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar6 * 8),
              *(undefined8 *)(*(long *)((long)pvVar2 + 0x30) + lVar6 * 8));
      pvVar2 = A->content;
      lVar3 = *(long *)((long)pvVar2 + 0x38);
    }
    fputc(10,(FILE *)outfile);
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

void SUNSparseMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  const char* matrixtype;
  const char* indexname;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    indexname  = "col";
    matrixtype = "CSC";
  }
  else
  {
    indexname  = "row";
    matrixtype = "CSR";
  }
  fprintf(outfile, "\n");
  fprintf(outfile, "%ld by %ld %s matrix, NNZ: %ld \n", (long int)SM_ROWS_S(A),
          (long int)SM_COLUMNS_S(A), matrixtype, (long int)SM_NNZ_S(A));
  for (j = 0; j < SM_NP_S(A); j++)
  {
    fprintf(outfile, "%s %ld : locations %ld to %ld\n", indexname, (long int)j,
            (long int)(SM_INDEXPTRS_S(A))[j],
            (long int)(SM_INDEXPTRS_S(A))[j + 1] - 1);
    fprintf(outfile, "  ");
    for (i = (SM_INDEXPTRS_S(A))[j]; i < (SM_INDEXPTRS_S(A))[j + 1]; i++)
    {
      fprintf(outfile, "%ld: " SUN_FORMAT_E "  ",
              (long int)(SM_INDEXVALS_S(A))[i], (SM_DATA_S(A))[i]);
    }
    fprintf(outfile, "\n");
  }
  return;
}